

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_287390::CAPIExternalCommand::executeExternalCommand
          (CAPIExternalCommand *this,BuildSystem *system,TaskInterface ti,
          QueueJobContext *job_context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  _func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr_void_ptr__func_void_void_ptr_llb_buildsystem_command_result_t_llb_build_value_ptr_ptr
  *p_Var1;
  CancellationDelegate *pCVar2;
  _func_llb_build_value_ptr_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
  *p_Var3;
  _func_llb_buildsystem_command_result_t_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
  *p_Var4;
  llb_buildsystem_command_result_t result;
  undefined8 *puVar5;
  undefined8 *puVar6;
  CancellationDelegate *pCVar7;
  llb_build_value *plVar8;
  char *pcVar9;
  ScopeDefer<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_apple[P]swift_llbuild_products_libllbuild_BuildSystem_C_API_cpp:1117:7)>
  _defer_2;
  undefined1 local_80 [56];
  code *local_48;
  char acStack_40 [8];
  bool local_38;
  
  local_80._24_8_ = ti.ctx;
  local_80._16_8_ = ti.impl;
  local_80._0_8_ = this;
  local_80._8_8_ = system;
  local_80._32_8_ = job_context;
  llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
  ::OptionalStorage((OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)
                    (local_80 + 0x28),&completionFn->Storage);
  p_Var1 = (this->cAPIDelegate).execute_command_detached;
  if (p_Var1 == (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr_void_ptr__func_void_void_ptr_llb_buildsystem_command_result_t_llb_build_value_ptr_ptr
                 *)0x0) {
    p_Var3 = (this->cAPIDelegate).execute_command_ex;
    if (p_Var3 != (_func_llb_build_value_ptr_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
                   *)0x0) {
      plVar8 = (*p_Var3)((this->cAPIDelegate).context,(llb_buildsystem_command_t *)this,
                         (llb_buildsystem_interface_t *)system,(llb_task_interface_t)ti,
                         (llb_buildsystem_queue_job_context_t *)job_context);
      this->currentBuildValue = (CAPIBuildValue *)plVar8;
      _defer_2.deferredWork.this =
           (anon_class_8_1_8991fb9c_for_deferredWork)(anon_class_8_1_8991fb9c_for_deferredWork)this;
      if (*(int *)plVar8 != 0) {
        executeExternalCommand::anon_class_80_5_b6e7d4dc::operator()
                  ((anon_class_80_5_b6e7d4dc *)local_80,Succeeded);
        llbuild::basic::
        ScopeDefer<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp:1117:7)>
        ::~ScopeDefer(&_defer_2);
        goto LAB_00183488;
      }
      llbuild::basic::
      ScopeDefer<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp:1117:7)>
      ::~ScopeDefer(&_defer_2);
    }
    p_Var4 = (this->cAPIDelegate).execute_command;
    if (p_Var4 == (_func_llb_buildsystem_command_result_t_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
                   *)0x0) {
      __assert_fail("cAPIDelegate.execute_command != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                    ,0x46b,
                    "virtual void (anonymous namespace)::CAPIExternalCommand::executeExternalCommand(BuildSystem &, core::TaskInterface, QueueJobContext *, llvm::Optional<ProcessCompletionFn>)"
                   );
    }
    result = (*p_Var4)((this->cAPIDelegate).context,(llb_buildsystem_command_t *)this,
                       (llb_buildsystem_interface_t *)system,(llb_task_interface_t)ti,
                       (llb_buildsystem_queue_job_context_t *)job_context);
    executeExternalCommand::anon_class_80_5_b6e7d4dc::operator()
              ((anon_class_80_5_b6e7d4dc *)local_80,result);
  }
  else {
    puVar5 = (undefined8 *)operator_new(0x30);
    *puVar5 = this;
    puVar5[1] = system;
    puVar5[2] = 0;
    puVar5[3] = 0;
    puVar5[4] = 0;
    puVar5[5] = 0;
    puVar6 = (undefined8 *)operator_new(0x50);
    *puVar6 = local_80._0_8_;
    puVar6[1] = local_80._8_8_;
    puVar6[2] = local_80._16_8_;
    puVar6[3] = local_80._24_8_;
    puVar6[4] = local_80._32_8_;
    *(bool *)(puVar6 + 9) = local_38;
    if (local_38 == true) {
      pcVar9 = (char *)(puVar6 + 5);
      pcVar9[0] = '\0';
      pcVar9[1] = '\0';
      pcVar9[2] = '\0';
      pcVar9[3] = '\0';
      pcVar9[4] = '\0';
      pcVar9[5] = '\0';
      pcVar9[6] = '\0';
      pcVar9[7] = '\0';
      puVar6[6] = 0;
      puVar6[7] = 0;
      puVar6[8] = acStack_40;
      if (local_48 != (code *)0x0) {
        *(undefined8 *)pcVar9 = local_80._40_8_;
        puVar6[6] = local_80._48_8_;
        puVar6[7] = local_48;
        local_48 = (code *)0x0;
        acStack_40[0] = '\0';
        acStack_40[1] = '\0';
        acStack_40[2] = '\0';
        acStack_40[3] = '\0';
        acStack_40[4] = '\0';
        acStack_40[5] = '\0';
        acStack_40[6] = '\0';
        acStack_40[7] = '\0';
      }
    }
    puVar5[2] = puVar6;
    puVar5[5] = std::
                _Function_handler<void_(llbuild::basic::ProcessStatus),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp:1007:19)>
                ::_M_invoke;
    puVar5[4] = std::
                _Function_handler<void_(llbuild::basic::ProcessStatus),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp:1007:19)>
                ::_M_manager;
    (*p_Var1)((this->cAPIDelegate).context,(llb_buildsystem_command_t *)this,
              (llb_buildsystem_interface_t *)system,(llb_task_interface_t)ti,
              (llb_buildsystem_queue_job_context_t *)job_context,puVar5,
              executeExternalCommand::ResultCallbackContext::callback);
    if ((this->cAPIDelegate).cancel_detached_command !=
        (_func_void_void_ptr_llb_buildsystem_command_t_ptr *)0x0) {
      pCVar7 = (CancellationDelegate *)operator_new(0x10);
      pCVar7->_vptr_CancellationDelegate = (_func_int **)&PTR__CancellationDelegate_00242180;
      pCVar7[1]._vptr_CancellationDelegate = (_func_int **)this;
      pCVar2 = (this->cancellationDelegate)._M_t.
               super___uniq_ptr_impl<llbuild::core::CancellationDelegate,_std::default_delete<llbuild::core::CancellationDelegate>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::core::CancellationDelegate_*,_std::default_delete<llbuild::core::CancellationDelegate>_>
               .super__Head_base<0UL,_llbuild::core::CancellationDelegate_*,_false>._M_head_impl;
      (this->cancellationDelegate)._M_t.
      super___uniq_ptr_impl<llbuild::core::CancellationDelegate,_std::default_delete<llbuild::core::CancellationDelegate>_>
      ._M_t.
      super__Tuple_impl<0UL,_llbuild::core::CancellationDelegate_*,_std::default_delete<llbuild::core::CancellationDelegate>_>
      .super__Head_base<0UL,_llbuild::core::CancellationDelegate_*,_false>._M_head_impl = pCVar7;
      if (pCVar2 != (CancellationDelegate *)0x0) {
        (*pCVar2->_vptr_CancellationDelegate[1])();
      }
      llbuild::buildsystem::BuildSystem::addCancellationDelegate
                (system,(this->cancellationDelegate)._M_t.
                        super___uniq_ptr_impl<llbuild::core::CancellationDelegate,_std::default_delete<llbuild::core::CancellationDelegate>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llbuild::core::CancellationDelegate_*,_std::default_delete<llbuild::core::CancellationDelegate>_>
                        .super__Head_base<0UL,_llbuild::core::CancellationDelegate_*,_false>.
                        _M_head_impl);
    }
  }
LAB_00183488:
  if ((local_38 == true) && (local_48 != (code *)0x0)) {
    (*local_48)(local_80 + 0x28,local_80 + 0x28,3);
  }
  return;
}

Assistant:

virtual void executeExternalCommand(BuildSystem& system,
                                      core::TaskInterface ti,
                                      QueueJobContext* job_context,
                                      llvm::Optional<ProcessCompletionFn> completionFn) override {
    auto doneFn = [this, &system, ti, job_context, completionFn](ProcessStatus result) mutable {
      if (result != ProcessStatus::Succeeded) {
        // If the command did not succeed, there is no need to gather dependencies.
        if (completionFn.hasValue())
          completionFn.getValue()(result);
        return;
      }

      // Otherwise, collect the discovered dependencies, if used.
      bool dependencyParsingResult = false;
      if (!depsPaths.empty()) {
        for (const auto& depsPath: depsPaths) {
          switch (depsFormat) {
            case llb_buildsystem_dependency_data_format_unused:
              ti.delegate()->error("No dependency format specified for discovered dependency files.");
              dependencyParsingResult = false;
              break;
            case llb_buildsystem_dependency_data_format_makefile:
              dependencyParsingResult = processMakefileDiscoveredDependencies(system, ti, job_context, depsPath, false);
              break;
            case llb_buildsystem_dependency_data_format_dependencyinfo:
              dependencyParsingResult = processDependencyInfoDiscoveredDependencies(system, ti, job_context, depsPath);
              break;
            case llb_buildsystem_dependency_data_format_makefile_ignoring_subsequent_outputs:
              dependencyParsingResult = processMakefileDiscoveredDependencies(system, ti, job_context, depsPath, true);
              break;
          }
          
          if (!dependencyParsingResult) {
            // If we were unable to process the dependencies output, report a
            // failure.
            if (completionFn.hasValue())
              completionFn.getValue()(ProcessStatus::Failed);
            return;
          }
        }
      }

      if (completionFn.hasValue())
        completionFn.getValue()(result);
    };

    if (cAPIDelegate.execute_command_detached) {
      struct ResultCallbackContext {
        CAPIExternalCommand *thisCommand;
        BuildSystem *buildSystem;
        std::function<void(ProcessStatus result)> doneFn;

        static void callback(void* result_ctx,
                             llb_buildsystem_command_result_t result,
                             llb_build_value* rvalue) {
          ResultCallbackContext *ctx = static_cast<ResultCallbackContext*>(result_ctx);
          auto thisCommand = ctx->thisCommand;
          BuildSystem &system = *ctx->buildSystem;
          auto doneFn = std::move(ctx->doneFn);
          delete ctx;

          thisCommand->detachedCommandFinished = true;
          if (auto cancellationDelegate = thisCommand->cancellationDelegate.get()) {
            system.removeCancellationDelegate(cancellationDelegate);
            thisCommand->cancellationDelegate = nullptr;
          }

          thisCommand->currentBuildValue = reinterpret_cast<CAPIBuildValue*>(rvalue);
          llbuild_defer {
            delete thisCommand->currentBuildValue;
            thisCommand->currentBuildValue = nullptr;
          };
          doneFn(getProcessStatusFromLLBResult(result));
        }
      };
      auto *callbackCtx = new ResultCallbackContext{this, &system, std::move(doneFn)};
      cAPIDelegate.execute_command_detached(
        cAPIDelegate.context,
        (llb_buildsystem_command_t*)this,
        (llb_buildsystem_interface_t*)&system,
        *reinterpret_cast<llb_task_interface_t*>(&ti),
        (llb_buildsystem_queue_job_context_t*)job_context,
        callbackCtx, ResultCallbackContext::callback);

      if (cAPIDelegate.cancel_detached_command) {
        class CAPICancellationDelegate: public core::CancellationDelegate {
          CAPIExternalCommand *thisCommand;

        public:
          CAPICancellationDelegate(CAPIExternalCommand *thisCommand) : thisCommand(thisCommand) {}

          void buildCancelled() override {
            if (thisCommand->detachedCommandFinished)
              return;
            thisCommand->cAPIDelegate.cancel_detached_command(
              thisCommand->cAPIDelegate.context,
              (llb_buildsystem_command_t*)this);
          }
        };
        this->cancellationDelegate = std::make_unique<CAPICancellationDelegate>(this);
        system.addCancellationDelegate(this->cancellationDelegate.get());
      }
      return;
    }

    if (cAPIDelegate.execute_command_ex) {
      llb_build_value* rvalue = cAPIDelegate.execute_command_ex(
        cAPIDelegate.context,
        (llb_buildsystem_command_t*)this,
        (llb_buildsystem_interface_t*)&system,
        *reinterpret_cast<llb_task_interface_t*>(&ti),
        (llb_buildsystem_queue_job_context_t*)job_context);

      currentBuildValue = reinterpret_cast<CAPIBuildValue*>(rvalue);
      llbuild_defer {
        delete currentBuildValue;
        currentBuildValue = nullptr;
      };

      if (!currentBuildValue->getInternalBuildValue().isInvalid()) {
        doneFn(ProcessStatus::Succeeded);
        return;
      }

      // An invalid value is interpreted as an unsupported method call and falls
      // through to execute_command below.
    }